

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtextdocument_p.cpp
# Opt level: O2

void __thiscall
QTextDocumentPrivate::adjustDocumentChangesAndCursors
          (QTextDocumentPrivate *this,int from,int addedOrRemoved,Operation op)

{
  undefined1 *puVar1;
  int iVar2;
  int iVar3;
  Span *pSVar4;
  QTextCursorPrivate *this_00;
  AdjustResult AVar5;
  int iVar6;
  int iVar7;
  ulong uVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  long in_FS_OFFSET;
  piter local_48;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if (this->editBlock == 0) {
    this->revision = this->revision + 1;
  }
  if ((this->field_0x294 & 2) == 0) {
    local_48 = (piter)QHash<QTextCursorPrivate_*,_QHashDummyValue>::begin(&(this->cursors).q_hash);
    while( true ) {
      if (local_48.d == (Data<QHashPrivate::Node<QTextCursorPrivate_*,_QHashDummyValue>_> *)0x0 &&
          local_48.bucket == 0) break;
      pSVar4 = (local_48.d)->spans;
      uVar8 = local_48.bucket >> 7;
      this_00 = *(QTextCursorPrivate **)
                 pSVar4[uVar8].entries[pSVar4[uVar8].offsets[(uint)local_48.bucket & 0x7f]].storage.
                 data;
      AVar5 = QTextCursorPrivate::adjustPosition(this_00,from,addedOrRemoved,op);
      if (AVar5 == CursorMoved) {
        puVar1 = &this_00->field_0x28;
        *puVar1 = *puVar1 | 4;
      }
      QHashPrivate::iterator<QHashPrivate::Node<QTextCursorPrivate_*,_QHashDummyValue>_>::operator++
                (&local_48);
    }
  }
  iVar7 = this->docChangeFrom;
  if (iVar7 < 0) {
    this->docChangeFrom = from;
    if (addedOrRemoved < 1) {
      this->docChangeOldLength = -addedOrRemoved;
      this->docChangeLength = 0;
    }
    else {
      this->docChangeOldLength = 0;
      this->docChangeLength = addedOrRemoved;
    }
  }
  else {
    iVar6 = 0;
    if (0 < addedOrRemoved) {
      iVar6 = addedOrRemoved;
    }
    iVar11 = -addedOrRemoved;
    if (-1 < addedOrRemoved) {
      iVar11 = 0;
    }
    iVar2 = iVar11 + from;
    if (iVar7 - iVar2 == 0 || iVar7 < iVar2) {
      iVar3 = this->docChangeLength;
      iVar10 = iVar3 + iVar7;
      iVar9 = 0;
      if (from - iVar10 != 0 && iVar10 <= from) {
        iVar9 = from - iVar10;
      }
    }
    else {
      iVar3 = this->docChangeLength;
      iVar10 = iVar3 + iVar7;
      iVar9 = iVar7 - iVar2;
    }
    if (iVar2 < iVar10) {
      iVar10 = iVar2;
    }
    iVar2 = from;
    if (from < iVar7) {
      iVar2 = iVar7;
    }
    if (iVar7 < from) {
      from = iVar7;
    }
    iVar7 = 0;
    if (0 < iVar10 - iVar2) {
      iVar7 = iVar10 - iVar2;
    }
    this->docChangeFrom = from;
    this->docChangeOldLength = (iVar11 + iVar9 + this->docChangeOldLength) - iVar7;
    this->docChangeLength = (iVar6 + iVar3 + iVar9) - iVar7;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QTextDocumentPrivate::adjustDocumentChangesAndCursors(int from, int addedOrRemoved, QTextUndoCommand::Operation op)
{
    if (!editBlock)
        ++revision;

    if (blockCursorAdjustment)  {
        ; // postpone, will be called again from QTextDocumentPrivate::remove()
    } else {
        for (QTextCursorPrivate *curs : std::as_const(cursors)) {
            if (curs->adjustPosition(from, addedOrRemoved, op) == QTextCursorPrivate::CursorMoved) {
                curs->changed = true;
            }
        }
    }

//     qDebug("QTextDocumentPrivate::adjustDocumentChanges: from=%d,addedOrRemoved=%d", from, addedOrRemoved);
    if (docChangeFrom < 0) {
        docChangeFrom = from;
        if (addedOrRemoved > 0) {
            docChangeOldLength = 0;
            docChangeLength = addedOrRemoved;
        } else {
            docChangeOldLength = -addedOrRemoved;
            docChangeLength = 0;
        }
//         qDebug("adjustDocumentChanges:");
//         qDebug("    -> %d %d %d", docChangeFrom, docChangeOldLength, docChangeLength);
        return;
    }

    // have to merge the new change with the already existing one.
    int added = qMax(0, addedOrRemoved);
    int removed = qMax(0, -addedOrRemoved);

    int diff = 0;
    if (from + removed < docChangeFrom)
        diff = docChangeFrom - from - removed;
    else if (from > docChangeFrom + docChangeLength)
        diff = from - (docChangeFrom + docChangeLength);

    int overlap_start = qMax(from, docChangeFrom);
    int overlap_end = qMin(from + removed, docChangeFrom + docChangeLength);
    int removedInside = qMax(0, overlap_end - overlap_start);
    removed -= removedInside;

//     qDebug("adjustDocumentChanges: from=%d, addedOrRemoved=%d, diff=%d, removedInside=%d", from, addedOrRemoved, diff, removedInside);
    docChangeFrom = qMin(docChangeFrom, from);
    docChangeOldLength += removed + diff;
    docChangeLength += added - removedInside + diff;
//     qDebug("    -> %d %d %d", docChangeFrom, docChangeOldLength, docChangeLength);

}